

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.hpp
# Opt level: O1

PositiveSet<double,_4UL> *
ruckig::roots::solve_quart_monic
          (PositiveSet<double,_4UL> *__return_storage_ptr__,double a,double b,double c,double d)

{
  bool bVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  (__return_storage_ptr__->super_Set<double,_4UL>).size = 0;
  if (2.220446049250313e-16 <= ABS(d)) {
LAB_00144c69:
    dVar7 = a * c + d * -4.0;
    dVar6 = b / -3.0;
    dVar8 = dVar6 * dVar6;
    dVar9 = dVar7 / -3.0 + dVar8;
    dVar8 = (((dVar8 + dVar8) - dVar7) * dVar6 + b * 4.0 * d + (-a * a * d - c * c)) * 0.5;
    dVar7 = dVar9 * dVar9 * dVar9;
    if (dVar7 <= dVar8 * dVar8) {
      dVar7 = dVar8 * dVar8 - dVar7;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = cbrt(ABS(dVar8) + dVar7);
      dVar5 = (double)(~-(ulong)(dVar8 < 0.0) & (ulong)-dVar7 | -(ulong)(dVar8 < 0.0) & (ulong)dVar7
                      );
      dVar8 = (double)(~-(ulong)(-dVar7 == dVar7) & (ulong)(dVar9 / dVar5));
      dVar7 = dVar5 + dVar8;
      dVar9 = dVar7 * -0.5 - dVar6;
      dVar8 = (dVar5 - dVar8) * 1.7320508075688772 * 0.5;
      bVar1 = 2.220446049250313e-16 <= ABS(dVar8);
      if (!bVar1) {
        dVar8 = dVar9;
      }
    }
    else {
      if (dVar9 < 0.0) {
        dVar5 = sqrt(dVar9);
      }
      else {
        dVar5 = SQRT(dVar9);
      }
      dVar8 = dVar8 / (dVar9 * dVar5);
      dVar7 = -1.0;
      if (-1.0 <= dVar8) {
        dVar7 = dVar8;
      }
      uVar3 = 0;
      uVar4 = 0x3ff00000;
      if (dVar7 <= 1.0) {
        uVar3 = SUB84(dVar7,0);
        uVar4 = (undefined4)((ulong)dVar7 >> 0x20);
      }
      dVar8 = acos((double)CONCAT44(uVar4,uVar3));
      dVar7 = cos(dVar8 / 3.0);
      dVar7 = dVar7 * dVar5 * -2.0;
      dVar8 = sin(dVar8 / 3.0);
      dVar8 = dVar8 * dVar5 * -2.0 * 0.8660254037844386;
      dVar9 = (dVar7 * -0.5 - dVar8) - dVar6;
      bVar1 = false;
      dVar8 = (dVar7 * -0.5 + dVar8) - dVar6;
    }
    dVar7 = dVar7 - dVar6;
    if ((!bVar1) &&
       (dVar7 = (double)(~-(ulong)(ABS(dVar7) < ABS(dVar9)) & (ulong)dVar7 |
                        (ulong)dVar9 & -(ulong)(ABS(dVar7) < ABS(dVar9))), ABS(dVar7) < ABS(dVar8)))
    {
      dVar7 = dVar8;
    }
    dVar6 = dVar7 * dVar7 + d * -4.0;
    if (2.220446049250313e-16 <= ABS(dVar6)) {
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar8 = (dVar7 + dVar6) * 0.5;
      dVar7 = (dVar7 - dVar6) * 0.5;
      dVar9 = (-a * dVar7 + c) / (dVar8 - dVar7);
      dVar6 = (a * dVar8 + -c) / (dVar8 - dVar7);
    }
    else {
      dVar8 = dVar7 * 0.5;
      dVar9 = a * a + (b - dVar7) * -4.0;
      dVar7 = dVar8;
      if (2.220446049250313e-16 <= ABS(dVar9)) {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar6 = (dVar9 + a) * 0.5;
        dVar9 = (a - dVar9) * 0.5;
      }
      else {
        dVar9 = a * 0.5;
        dVar6 = dVar9;
      }
    }
    dVar8 = dVar6 * dVar6 + dVar8 * -4.0;
    if (3.552713678800501e-15 <= ABS(dVar8)) {
      if (0.0 < dVar8) {
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dVar5 = (-dVar6 - dVar8) * 0.5;
        if (0.0 <= dVar5) {
          (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = dVar5;
          (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
        }
        dVar6 = (dVar8 - dVar6) * 0.5;
        if (0.0 <= dVar6) {
          sVar2 = (__return_storage_ptr__->super_Set<double,_4UL>).size;
          (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar2] = dVar6;
          sVar2 = sVar2 + 1;
          goto LAB_001451d1;
        }
      }
    }
    else if (0.0 <= dVar6 * -0.5) {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = dVar6 * -0.5;
      sVar2 = 1;
LAB_001451d1:
      (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar2;
    }
    dVar7 = dVar9 * dVar9 + dVar7 * -4.0;
    if (3.552713678800501e-15 <= ABS(dVar7)) {
      if (dVar7 <= 0.0) {
        return __return_storage_ptr__;
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar6 = (-dVar9 - dVar7) * 0.5;
      if (0.0 <= dVar6) {
        sVar2 = (__return_storage_ptr__->super_Set<double,_4UL>).size;
        (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar2] = dVar6;
        (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar2 + 1;
      }
      dVar7 = dVar7 - dVar9;
joined_r0x0014528a:
      if (dVar7 * 0.5 < 0.0) {
        return __return_storage_ptr__;
      }
      sVar2 = (__return_storage_ptr__->super_Set<double,_4UL>).size;
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar2] = dVar7 * 0.5;
    }
    else {
      if (dVar9 * -0.5 < 0.0) {
        return __return_storage_ptr__;
      }
      sVar2 = (__return_storage_ptr__->super_Set<double,_4UL>).size;
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar2] = dVar9 * -0.5;
    }
    sVar2 = sVar2 + 1;
  }
  else {
    if (2.220446049250313e-16 <= ABS(c)) {
      if ((2.220446049250313e-16 <= ABS(a)) || (2.220446049250313e-16 <= ABS(b))) goto LAB_00144c69;
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = 0.0;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      dVar7 = cbrt(c);
      if (0.0 < dVar7) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = -dVar7;
    }
    else {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = 0.0;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      dVar7 = a * a + b * -4.0;
      if (2.220446049250313e-16 <= ABS(dVar7)) {
        if (dVar7 <= 0.0) {
          return __return_storage_ptr__;
        }
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar6 = (-a - dVar7) * 0.5;
        if (0.0 <= dVar6) {
          (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = dVar6;
          (__return_storage_ptr__->super_Set<double,_4UL>).size = 2;
        }
        dVar7 = dVar7 - a;
        goto joined_r0x0014528a;
      }
      if (a * -0.5 < 0.0) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = a * -0.5;
    }
    sVar2 = 2;
  }
  (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar2;
  return __return_storage_ptr__;
}

Assistant:

inline PositiveSet<double, 4> solve_quart_monic(double a, double b, double c, double d) {
    PositiveSet<double, 4> roots;

    if (std::abs(d) < DBL_EPSILON) {
        if (std::abs(c) < DBL_EPSILON) {
            roots.insert(0.0);

            const double D = a * a - 4 * b;
            if (std::abs(D) < DBL_EPSILON) {
                roots.insert(-a / 2);
            } else if (D > 0.0) {
                const double sqrtD = std::sqrt(D);
                roots.insert((-a - sqrtD) / 2);
                roots.insert((-a + sqrtD) / 2);
            }
            return roots;
        }

        if (std::abs(a) < DBL_EPSILON && std::abs(b) < DBL_EPSILON) {
            roots.insert(0.0);
            roots.insert(-std::cbrt(c));
            return roots;
        }
    }

    const double a3 = -b;
    const double b3 = a * c - 4 * d;
    const double c3 = -a * a * d - c * c + 4 * b * d;

    std::array<double, 3> x3;
    const int number_zeroes = solve_resolvent(x3, a3, b3, c3);

    double y = x3[0];
    // Choosing Y with maximal absolute value.
    if (number_zeroes != 1) {
        if (std::abs(x3[1]) > std::abs(y)) {
            y = x3[1];
        }
        if (std::abs(x3[2]) > std::abs(y)) {
            y = x3[2];
        }
    }

    double q1, q2, p1, p2;

    double D = y * y - 4 * d;
    if (std::abs(D) < DBL_EPSILON) {
        q1 = q2 = y / 2;
        D = a * a - 4 * (b - y);
        if (std::abs(D) < DBL_EPSILON) {
            p1 = p2 = a / 2;
        } else {
            const double sqrtD = std::sqrt(D);
            p1 = (a + sqrtD) / 2;
            p2 = (a - sqrtD) / 2;
        }
    } else {
        const double sqrtD = std::sqrt(D);
        q1 = (y + sqrtD) / 2;
        q2 = (y - sqrtD) / 2;
        p1 = (a * q1 - c) / (q1 - q2);
        p2 = (c - a * q2) / (q1 - q2);
    }

    constexpr double eps {16 * DBL_EPSILON};

    D = p1 * p1 - 4 * q1;
    if (std::abs(D) < eps) {
        roots.insert(-p1 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p1 - sqrtD) / 2);
        roots.insert((-p1 + sqrtD) / 2);
    }

    D = p2 * p2 - 4 * q2;
    if (std::abs(D) < eps) {
        roots.insert(-p2 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p2 - sqrtD) / 2);
        roots.insert((-p2 + sqrtD) / 2);
    }

    return roots;
}